

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::checkTorsions(FragmentStamp *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  value_type_conflict2 *pvVar1;
  ulong uVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  undefined8 uVar6;
  reference piVar7;
  reference pvVar8;
  value_type_conflict2 *__x;
  size_type sVar9;
  OpenMDException *this_00;
  string *msg;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>,_bool> pVar10;
  type_conflict *fourth;
  type_conflict *third;
  type_conflict *second;
  type_conflict *first;
  tuple<int,_int,_int,_int> torsionTuple;
  iterator j_2;
  int ghostIndex;
  vector<int,_std::allocator<int>_> torsion;
  TorsionStamp *torsionStamp_2;
  size_t i_2;
  iterator iter;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allTorsions;
  int rigidbodyIndex;
  iterator j_1;
  vector<int,_std::allocator<int>_> rigidSet;
  vector<int,_std::allocator<int>_> torsionAtoms_1;
  TorsionStamp *torsionStamp_1;
  size_t i_1;
  iterator k;
  iterator j;
  vector<int,_std::allocator<int>_> torsionAtoms;
  TorsionStamp *torsionStamp;
  size_t i;
  ostringstream oss;
  FragmentStamp *in_stack_fffffffffffff948;
  FragmentStamp *in_stack_fffffffffffff950;
  string *in_stack_fffffffffffff958;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff960;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff968;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff980;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff988;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9e0;
  const_iterator in_stack_fffffffffffff9e8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9f0;
  bool local_569;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffaf8;
  string local_4f8 [32];
  string local_4d8 [32];
  _Base_ptr local_4b8;
  undefined1 local_4b0;
  _Self local_4a8;
  _Base_ptr local_4a0;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int>_> *local_498;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_int>_> *local_490;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int>_> *local_488;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int>_> *local_480;
  undefined1 *local_478;
  undefined1 local_470 [16];
  int *local_460;
  int *local_450;
  int *local_448;
  int *local_440;
  int *local_438;
  int local_42c;
  vector<int,_std::allocator<int>_> local_428;
  TorsionStamp *local_410;
  value_type_conflict2 *local_408;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_> local_400 [7];
  undefined1 local_3c1;
  string local_3a0 [32];
  string local_380 [36];
  int local_35c;
  int *local_358;
  int *local_350;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_348;
  undefined4 local_33c;
  vector<int,_std::allocator<int>_> local_338 [2];
  TorsionStamp *local_308;
  ulong local_300;
  undefined1 local_2f1;
  string local_2d0 [32];
  string local_2b0 [39];
  undefined1 local_289;
  string local_268 [32];
  string local_248 [32];
  int *local_228;
  int *local_220;
  undefined4 local_218;
  int *local_208;
  int *local_200;
  int *local_1f8;
  long local_1f0;
  int *local_1d0;
  int *local_1c8;
  int *local_1c0;
  TorsionStamp *local_1a0;
  ulong local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188 = 0;
  while( true ) {
    uVar2 = local_188;
    sVar4 = getNTorsions((FragmentStamp *)0x358015);
    if (sVar4 <= uVar2) {
      local_300 = 0;
      do {
        uVar2 = local_300;
        sVar4 = getNTorsions((FragmentStamp *)0x3586ca);
        if (sVar4 <= uVar2) {
          std::
          set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
          ::set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 *)0x358b36);
          std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>::_Rb_tree_const_iterator
                    (local_400);
          local_408 = (value_type_conflict2 *)0x0;
          while( true ) {
            pvVar1 = local_408;
            __x = (value_type_conflict2 *)getNTorsions((FragmentStamp *)0x358b6c);
            if (__x <= pvVar1) {
              std::
              set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
              ::~set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                      *)0x3590e3);
              std::__cxx11::ostringstream::~ostringstream(local_180);
              return;
            }
            local_410 = getTorsionStamp(in_stack_fffffffffffff950,
                                        (int)((ulong)in_stack_fffffffffffff948 >> 0x20));
            TorsionStamp::getMembers((TorsionStamp *)in_stack_fffffffffffff948);
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_428);
            if (sVar9 == 3) {
              local_42c = TorsionStamp::getGhostVectorSource((TorsionStamp *)0x358bf8);
              local_440 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffff948);
              local_448 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffff948);
              local_438 = (int *)std::
                                 find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                           (in_stack_fffffffffffff968,in_stack_fffffffffffff960,
                                            (int *)in_stack_fffffffffffff958);
              local_450 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffff948);
              bVar3 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff950,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff948);
              if (bVar3) {
                __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
                __normal_iterator<int*>
                          ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)in_stack_fffffffffffff950,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffff948);
                local_460 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                             (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9e8,
                                              __x);
              }
            }
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,0);
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,1);
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,2);
            std::vector<int,_std::allocator<int>_>::operator[](&local_428,3);
            std::tuple<int,_int,_int,_int>::tuple<int_&,_int_&,_int_&,_int_&,_true,_true>
                      ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffff960._M_current,
                       (int *)in_stack_fffffffffffff958,(int *)in_stack_fffffffffffff950,
                       (int *)in_stack_fffffffffffff948,(int *)0x358d87);
            local_478 = local_470;
            local_480 = std::get<0ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x358da4);
            local_488 = std::get<1ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x358db9);
            local_490 = std::get<2ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x358dce);
            local_498 = std::get<3ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x358de3);
            if (*local_498 < *local_480) {
              std::swap<int>(local_480,local_498);
              std::swap<int>(local_488,local_490);
            }
            local_4a0 = (_Base_ptr)
                        std::
                        set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                        ::find((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                *)in_stack_fffffffffffff958,(key_type *)in_stack_fffffffffffff950);
            local_400[0]._M_node = local_4a0;
            local_4a8._M_node =
                 (_Base_ptr)
                 std::
                 set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                 ::end((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                        *)in_stack_fffffffffffff948);
            bVar3 = std::operator==(local_400,&local_4a8);
            if (!bVar3) break;
            pVar10 = std::
                     set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                     ::insert((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                               *)in_stack_fffffffffffff970._M_current,
                              (value_type *)in_stack_fffffffffffff968._M_current);
            local_4b8 = (_Base_ptr)pVar10.first._M_node;
            local_4b0 = pVar10.second;
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960._M_current);
            local_408 = (value_type_conflict2 *)((long)local_408 + 1);
          }
          poVar5 = std::operator<<((ostream *)local_180,"Error in Fragment ");
          getName_abi_cxx11_(in_stack_fffffffffffff948);
          poVar5 = std::operator<<(poVar5,local_4d8);
          this_00 = (OpenMDException *)std::operator<<(poVar5,": ");
          msg = (string *)std::operator<<((ostream *)this_00,"Torsion");
          containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffaf8);
          poVar5 = std::operator<<((ostream *)msg,local_4f8);
          std::operator<<(poVar5," appears multiple times\n");
          std::__cxx11::string::~string(local_4f8);
          std::__cxx11::string::~string(local_4d8);
          uVar6 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException(this_00,msg);
          __cxa_throw(uVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_308 = getTorsionStamp(in_stack_fffffffffffff950,
                                    (int)((ulong)in_stack_fffffffffffff948 >> 0x20));
        TorsionStamp::getMembers((TorsionStamp *)in_stack_fffffffffffff948);
        getNRigidBodies((FragmentStamp *)0x35873f);
        local_33c = 0;
        std::allocator<int>::allocator((allocator<int> *)0x358769);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970._M_current,
                   (size_type)in_stack_fffffffffffff968._M_current,
                   in_stack_fffffffffffff960._M_current,(allocator_type *)in_stack_fffffffffffff958)
        ;
        std::allocator<int>::~allocator((allocator<int> *)0x35879d);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
        __normal_iterator(&local_348);
        local_350 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff948
                                     );
        local_348._M_current = local_350;
        while( true ) {
          local_358 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffff948);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff950,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff948);
          if (!bVar3) break;
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_348);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(long)*piVar7);
          local_35c = *pvVar8;
          if (-1 < local_35c) {
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_338,(long)local_35c);
            *pvVar8 = *pvVar8 + 1;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_338,(long)local_35c);
            if (3 < *pvVar8) {
              poVar5 = std::operator<<((ostream *)local_180,"Error in Fragment ");
              getName_abi_cxx11_(in_stack_fffffffffffff948);
              poVar5 = std::operator<<(poVar5,local_380);
              poVar5 = std::operator<<(poVar5,": torsion");
              containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffaf8);
              poVar5 = std::operator<<(poVar5,local_3a0);
              std::operator<<(poVar5,"has four atoms on the same rigid body\n");
              std::__cxx11::string::~string(local_3a0);
              std::__cxx11::string::~string(local_380);
              local_3c1 = 1;
              uVar6 = __cxa_allocate_exception(0x28);
              std::__cxx11::ostringstream::str();
              OpenMDException::OpenMDException
                        ((OpenMDException *)in_stack_fffffffffffff960._M_current,
                         in_stack_fffffffffffff958);
              local_3c1 = 0;
              __cxa_throw(uVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_348);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960._M_current);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960._M_current);
        local_300 = local_300 + 1;
      } while( true );
    }
    local_1a0 = getTorsionStamp(in_stack_fffffffffffff950,
                                (int)((ulong)in_stack_fffffffffffff948 >> 0x20));
    TorsionStamp::getMembers((TorsionStamp *)in_stack_fffffffffffff948);
    local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff948);
    local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff948);
    sVar4 = getNAtoms((FragmentStamp *)0x3580bc);
    local_1f0 = sVar4 - 1;
    std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
              ((greater<int> *)in_stack_fffffffffffff958,
               (_Placeholder<1> *)in_stack_fffffffffffff950,
               (unsigned_long *)in_stack_fffffffffffff948);
    local_1c0 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                                 (in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                                  (_Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> *)
                                  CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
    local_200 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff948);
    local_208 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff948);
    local_218 = 0;
    std::bind<std::less<int>,std::_Placeholder<1>const&,int>
              ((less<int> *)in_stack_fffffffffffff958,(_Placeholder<1> *)in_stack_fffffffffffff950,
               (int *)in_stack_fffffffffffff948);
    __first._M_current._7_1_ = in_stack_fffffffffffff97f;
    __first._M_current._0_7_ = in_stack_fffffffffffff978;
    local_1f8 = (int *)std::
                       find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                                 (__first,in_stack_fffffffffffff970,
                                  in_stack_fffffffffffff968._M_current);
    local_220 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff948);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff950,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff948);
    local_569 = true;
    if (!bVar3) {
      local_228 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff948);
      local_569 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff950,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff948);
    }
    if (local_569 != false) break;
    bVar3 = hasDuplicateElement<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff9f0);
    if (bVar3) {
      poVar5 = std::operator<<((ostream *)local_180,"Error in Fragment ");
      getName_abi_cxx11_(in_stack_fffffffffffff948);
      poVar5 = std::operator<<(poVar5,local_2b0);
      poVar5 = std::operator<<(poVar5," : atoms of torsion");
      containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffaf8);
      poVar5 = std::operator<<(poVar5,local_2d0);
      std::operator<<(poVar5," have duplicated indices\n");
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2b0);
      local_2f1 = 1;
      uVar6 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffff960._M_current,in_stack_fffffffffffff958);
      local_2f1 = 0;
      __cxa_throw(uVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960._M_current);
    local_188 = local_188 + 1;
  }
  poVar5 = std::operator<<((ostream *)local_180,"Error in Fragment ");
  getName_abi_cxx11_(in_stack_fffffffffffff948);
  poVar5 = std::operator<<(poVar5,local_248);
  poVar5 = std::operator<<(poVar5,": atoms of torsion");
  containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffaf8);
  poVar5 = std::operator<<(poVar5,local_268);
  std::operator<<(poVar5," have invalid indices\n");
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_248);
  local_289 = 1;
  uVar6 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException
            ((OpenMDException *)in_stack_fffffffffffff960._M_current,in_stack_fffffffffffff958);
  local_289 = 0;
  __cxa_throw(uVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void FragmentStamp::checkTorsions() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int>::iterator j  = std::find_if(
          torsionAtoms.begin(), torsionAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != torsionAtoms.end() || k != torsionAtoms.end()) {
        oss << "Error in Fragment " << getName() << ": atoms of torsion"
            << containerToString(torsionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }
      if (hasDuplicateElement(torsionAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of torsion"
            << containerToString(torsionAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = torsionAtoms.begin(); j != torsionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Fragment " << getName() << ": torsion"
                << containerToString(torsionAtoms)
                << "has four atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allTorsions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp = getTorsionStamp(i);
      std::vector<int> torsion   = torsionStamp->getMembers();
      if (torsion.size() == 3) {
        int ghostIndex = torsionStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(torsion.begin(), torsion.end(), ghostIndex);
        if (j != torsion.end()) { torsion.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int, int> torsionTuple(torsion[0], torsion[1],
                                                  torsion[2], torsion[3]);
      auto& [first, second, third, fourth] = torsionTuple;

      if (first > fourth) {
        std::swap(first, fourth);
        std::swap(second, third);
      }

      iter = allTorsions.find(torsionTuple);
      if (iter == allTorsions.end()) {
        allTorsions.insert(torsionTuple);
      } else {
        oss << "Error in Fragment " << getName() << ": "
            << "Torsion" << containerToString(torsion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }
  }